

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

int replay_display_menu(nh_menuitem *items,int icount,char *title,int how,int *results)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcStack_58;
  boolean id_ok;
  char *resultbuf;
  char *token;
  int local_40;
  int val;
  int j;
  int i;
  int *results_local;
  char *pcStack_28;
  int how_local;
  char *title_local;
  nh_menuitem *pnStack_18;
  int icount_local;
  nh_menuitem *items_local;
  
  if (how == 0) {
    items_local._4_4_ = 0;
  }
  else {
    _j = results;
    results_local._4_4_ = how;
    pcStack_28 = title;
    title_local._4_4_ = icount;
    pnStack_18 = items;
    pcVar4 = next_log_token();
    if ((pcVar4 == (char *)0x0) || (*pcVar4 != 'm')) {
      parse_error("Bad menu data");
    }
    pcStack_58 = pcVar4 + 3;
    if (pcVar4[2] == 'x') {
      items_local._4_4_ = -1;
    }
    else {
      val = 0;
      while( true ) {
        iVar3 = __isoc99_sscanf(pcStack_58,"%x:",(long)&token + 4);
        if (iVar3 == 0) break;
        bVar2 = false;
        local_40 = 0;
        while( true ) {
          bVar1 = false;
          if (local_40 < title_local._4_4_) {
            bVar1 = (bool)(bVar2 ^ 1);
          }
          if (!bVar1) break;
          if (pnStack_18[local_40].id == token._4_4_) {
            bVar2 = true;
          }
          local_40 = local_40 + 1;
        }
        if (!bVar2) {
          parse_error("Invalid menu id in menu data");
        }
        _j[val] = token._4_4_;
        val = val + 1;
        pcStack_58 = strchr(pcStack_58,0x3a);
        pcStack_58 = pcStack_58 + 1;
      }
      items_local._4_4_ = val;
    }
  }
  return items_local._4_4_;
}

Assistant:

static int replay_display_menu(struct nh_menuitem *items, int icount,
				const char *title, int how, int *results)
{
    int i, j, val;
    char *token;
    char *resultbuf;
    boolean id_ok;
    
    if (how == PICK_NONE)
	return 0;
    
    token = next_log_token();
    if (!token || token[0] != 'm')
	parse_error("Bad menu data");
    resultbuf = token + 2;
    
    if (*resultbuf++ == 'x')
	return -1;
    
    i = 0;
    while (sscanf(resultbuf, "%x:", &val)) {
	/* make sure all ids are valid - program changes could have broken the save */
	id_ok  = FALSE;
	for (j = 0; j < icount && !id_ok; j++)
	    if (items[j].id == val)
		id_ok = TRUE;
	if (!id_ok)
	    parse_error("Invalid menu id in menu data");
	
	results[i++] = val;
	resultbuf = strchr(resultbuf, ':') + 1;
    }

    return i;
}